

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O1

void * SstFFSGetBlocksInfo(SstStream Stream,void *Variable)

{
  int *piVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  void *pvVar5;
  size_t *psVar6;
  long lVar7;
  long *plVar8;
  FFSReaderMarshalBase *Info;
  ulong uVar9;
  
  piVar1 = (int *)Stream->ReaderMarshalData;
  if (0 < (long)*piVar1) {
    lVar7 = 0;
    do {
      plVar8 = *(long **)(*(long *)(piVar1 + 2) + lVar7 * 8);
      if ((void *)*plVar8 == Variable) goto LAB_00743218;
      lVar7 = lVar7 + 1;
    } while (*piVar1 != lVar7);
  }
  plVar8 = (long *)0x0;
LAB_00743218:
  if (Stream->MinArraySetupUpcall == (MinArraySetupUpcallFunc)0x0) {
    pvVar5 = (void *)0x0;
  }
  else {
    pvVar5 = (*Stream->MinArraySetupUpcall)
                       (Stream->SetupUpcallReader,
                        *(int *)(**(long **)(piVar1 + 8) + *(long *)plVar8[2]),
                        *(size_t **)(**(long **)(piVar1 + 8) + 0x10 + *(long *)plVar8[2]));
    if (0 < Stream->WriterCohortSize) {
      lVar7 = 0;
      do {
        if (*(long *)(plVar8[7] + lVar7 * 8) != 0) {
          lVar2 = *(long *)(*(long *)(piVar1 + 8) + lVar7 * 8);
          lVar3 = *(long *)(plVar8[2] + lVar7 * 8);
          uVar9 = 0;
          do {
            lVar4 = *(long *)(lVar2 + 0x20 + lVar3);
            if (lVar4 == 0) {
              psVar6 = (size_t *)0x0;
            }
            else {
              psVar6 = (size_t *)(lVar4 + *(long *)(lVar2 + lVar3) * uVar9 * 8);
            }
            (*Stream->ArrayBlocksInfoUpcall)
                      (Stream->SetupUpcallReader,pvVar5,(int)plVar8[4],(int)lVar7,
                       *(int *)(lVar2 + lVar3),*(size_t **)(lVar2 + 0x10 + lVar3),psVar6,
                       *(size_t **)(lVar2 + 0x18 + lVar3));
            uVar9 = uVar9 + 1;
          } while (uVar9 < *(ulong *)(plVar8[7] + lVar7 * 8));
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < Stream->WriterCohortSize);
    }
  }
  return pvVar5;
}

Assistant:

extern void *SstFFSGetBlocksInfo(SstStream Stream, void *Variable)
{
    struct FFSReaderMarshalBase *Info = Stream->ReaderMarshalData;
    FFSVarRec VarRec = LookupVarByKey(Stream, Variable);
    MetaArrayRec *meta_base = (MetaArrayRec *)(((char *)Info->MetadataBaseAddrs[0]) +
                                               VarRec->PerWriterMetaFieldOffset[0]);
    if (!Stream->MinArraySetupUpcall)
        return NULL;

    void *Ret = Stream->MinArraySetupUpcall(Stream->SetupUpcallReader, (int)meta_base->Dims,
                                            meta_base->Shape);
    for (int WriterRank = 0; WriterRank < Stream->WriterCohortSize; WriterRank++)
    {
        meta_base = (MetaArrayRec *)(((char *)Info->MetadataBaseAddrs[WriterRank]) +
                                     VarRec->PerWriterMetaFieldOffset[WriterRank]);

        for (int i = 0; i < VarRec->PerWriterBlockCount[WriterRank]; i++)
        {
            size_t *Offsets = NULL;
            if (meta_base->Offsets)
                Offsets = meta_base->Offsets + (i * meta_base->Dims);
            Stream->ArrayBlocksInfoUpcall(Stream->SetupUpcallReader, Ret, VarRec->Type, WriterRank,
                                          (int)meta_base->Dims, meta_base->Shape, Offsets,
                                          meta_base->Count);
        }
    }
    return Ret;
}